

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall Sequence::newSeq(Sequence *this)

{
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_ptr *p_Var6;
  EqGrNode_S *pEVar7;
  reference pvVar8;
  reference this_00;
  __shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
  local_58;
  undefined1 local_48 [8];
  FreqIt_SS fit;
  undefined1 local_28 [8];
  EqGrNode_S x;
  int j;
  int i;
  Sequence *this_local;
  
  peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  if (peVar3->use_hash != 0) {
    peVar4 = std::
             __shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->FreqArray);
    std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::reserve
              (peVar4,this->FreqArraySz);
  }
  peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  if (peVar3->use_ascending == -2) {
    peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->args);
    x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         peVar3->dbase_max_item;
    while (x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
                x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ +
                -1, -1 < x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi._4_4_) {
      peVar5 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->invdb);
      pEVar7 = InvertDatabase::get_eqgraph_item
                         (peVar5,x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._4_4_);
      std::shared_ptr<EqGrNode>::shared_ptr((shared_ptr<EqGrNode> *)local_28,pEVar7);
      bVar2 = std::operator!=((shared_ptr<EqGrNode> *)local_28,(nullptr_t)0x0);
      if (bVar2) {
        peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->args);
        if (peVar3->use_hash != 0) {
          this->FreqArrayPos = 0;
        }
        process_class(this,x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi._4_4_);
        peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->args);
        if ((peVar3->use_hash != 0) && (0 < this->FreqArrayPos)) {
          std::
          make_shared<std::vector<std::shared_ptr<FreqIt>,std::allocator<std::shared_ptr<FreqIt>>>,int&>
                    ((int *)local_48);
          for (x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
                    0; (int)x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi < this->FreqArrayPos;
              x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
                   (int)x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   + 1) {
            peVar4 = std::
                     __shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->FreqArray);
            pvVar8 = std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>
                     ::at(peVar4,(long)(int)x.
                                            super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
            peVar4 = std::
                     __shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_48);
            this_00 = std::
                      vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::at
                                (peVar4,(long)(int)x.
                                                  super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
            std::shared_ptr<FreqIt>::operator=(this_00,pvVar8);
          }
          peVar5 = std::
                   __shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->invdb);
          this_01 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    InvertDatabase::get_eqgraph_item
                              (peVar5,x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi._4_4_);
          this_02 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(this_01);
          std::
          shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
          ::shared_ptr(&local_58,
                       (shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
                        *)local_48);
          EqGrNode::set_freqarray(this_02,&local_58,this->FreqArrayPos);
          std::
          shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
          ::~shared_ptr(&local_58);
          std::
          shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
          ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
                         *)local_48);
        }
      }
      std::shared_ptr<EqGrNode>::~shared_ptr((shared_ptr<EqGrNode> *)local_28);
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->args);
    if (peVar3->use_ascending == -1) {
      for (x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
          iVar1 = x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
          , peVar3 = std::
                     __shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->args), iVar1 < peVar3->dbase_max_item;
          x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
               x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ +
               1) {
        peVar5 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->invdb);
        p_Var6 = (__shared_ptr *)
                 InvertDatabase::get_eqgraph_item
                           (peVar5,x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._4_4_);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var6);
        if (bVar2) {
          process_class(this,x.super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_);
        }
      }
    }
    else {
      peVar5 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->invdb);
      peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->args);
      p_Var6 = (__shared_ptr *)InvertDatabase::get_eqgraph_item(peVar5,peVar3->use_ascending);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var6);
      if (bVar2) {
        peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->args);
        process_class(this,peVar3->use_ascending);
      }
    }
  }
  return;
}

Assistant:

void Sequence::newSeq() {
    int i, j;

    if (args->use_hash) {
        FreqArray->reserve(FreqArraySz);
    }
    //form large itemsets for each eqclass
    if (args->use_ascending != -2) {
        if (args->use_ascending == -1) {
            for (i = 0; i < args->dbase_max_item; i++)
                if (invdb->get_eqgraph_item(i)) {
                    process_class(i);
                }
        } else if (invdb->get_eqgraph_item(args->use_ascending))
            process_class(args->use_ascending);
    } else {
        for (i = args->dbase_max_item - 1; i >= 0; i--) {
            auto x = invdb->get_eqgraph_item(i);
            if (x != nullptr) {
                if (args->use_hash) FreqArrayPos = 0;
                process_class(i);
                if (args->use_hash) {
                    if (FreqArrayPos > 0) {
                        FreqIt_SS fit = make_shared<vector<FreqIt_S>>(FreqArrayPos);
                        for (j = 0; j < FreqArrayPos; j++) {
                            fit->at(j) = FreqArray->at(j);
                        }
                        invdb->get_eqgraph_item(i)->set_freqarray(fit, FreqArrayPos);
                    }
                }
            }
        }
    }
}